

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::skipgram
          (FastText *this,State *state,real lr,vector<int,_std::allocator<int>_> *line)

{
  result_type_conflict1 rVar1;
  ulong uVar2;
  size_type sVar3;
  Dictionary *pDVar4;
  vector<int,_std::allocator<int>_> *in_RDX;
  Model *in_RSI;
  undefined4 in_XMM0_Da;
  int32_t c;
  vector<int,_std::allocator<int>_> *ngrams;
  int32_t boundary;
  int32_t w;
  uniform_int_distribution<int> uniform;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  Dictionary *in_stack_ffffffffffffffa0;
  undefined4 local_3c;
  int iVar5;
  real in_stack_ffffffffffffffd8;
  int32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b63e8);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
             in_stack_ffffffffffffff98);
  iVar5 = 0;
  while( true ) {
    uVar2 = (ulong)iVar5;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
    if (sVar3 <= uVar2) break;
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)in_stack_ffffffffffffffa0,
                       (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1b644f);
    std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)iVar5);
    Dictionary::getSubwords(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    for (local_3c = -rVar1; local_3c <= rVar1; local_3c = local_3c + 1) {
      if ((local_3c != 0) && (-1 < iVar5 + local_3c)) {
        in_stack_ffffffffffffffa0 = (Dictionary *)(long)(iVar5 + local_3c);
        pDVar4 = (Dictionary *)std::vector<int,_std::allocator<int>_>::size(in_RDX);
        if (in_stack_ffffffffffffffa0 < pDVar4) {
          std::__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b64d0);
          Model::update(in_RSI,(vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8),in_RDX,
                        in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                        (State *)CONCAT44(iVar5,rVar1));
        }
      }
    }
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

void FastText::skipgram(
    Model::State& state,
    real lr,
    const std::vector<int32_t>& line) {
  std::uniform_int_distribution<> uniform(1, args_->ws);
  for (int32_t w = 0; w < line.size(); w++) {
    int32_t boundary = uniform(state.rng);
    const std::vector<int32_t>& ngrams = dict_->getSubwords(line[w]);
    for (int32_t c = -boundary; c <= boundary; c++) {
      if (c != 0 && w + c >= 0 && w + c < line.size()) {
        model_->update(ngrams, line, w + c, lr, state);
      }
    }
  }
}